

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

HdlcByte * __thiscall
HdlcAnalyzer::ByteAsyncProcessFlags(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  bool bVar1;
  undefined6 uVar2;
  reference pvVar3;
  vector<HdlcByte,_std::allocator<HdlcByte>_> local_90;
  undefined4 local_74;
  vector<HdlcByte,_std::allocator<HdlcByte>_> local_70;
  undefined1 local_48 [8];
  HdlcByte asyncByte;
  vector<HdlcByte,_std::allocator<HdlcByte>_> readBytes;
  bool flagEncountered;
  HdlcAnalyzer *this_local;
  
  bVar1 = false;
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector
            ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value);
  do {
    ReadByte((HdlcByte *)local_48,this);
    if (((char)asyncByte.endSample != '~') && (bVar1)) {
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::push_back
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value,
                 (value_type *)local_48);
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector
                (&local_90,(vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value);
      GenerateFlagsFrames(this,&local_90);
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::~vector(&local_90);
      pvVar3 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::back
                         ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value);
      __return_storage_ptr__->startSample = pvVar3->startSample;
      __return_storage_ptr__->endSample = pvVar3->endSample;
      bVar1 = pvVar3->escaped;
      uVar2 = *(undefined6 *)&pvVar3->field_0x12;
      __return_storage_ptr__->value = pvVar3->value;
      __return_storage_ptr__->escaped = bVar1;
      *(undefined6 *)&__return_storage_ptr__->field_0x12 = uVar2;
      goto LAB_00118044;
    }
    if ((char)asyncByte.endSample == '~') {
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::push_back
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value,
                 (value_type *)local_48);
      bVar1 = true;
    }
  } while ((this->mAbortFrame & 1U) == 0);
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector
            (&local_70,(vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value);
  GenerateFlagsFrames(this,&local_70);
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::~vector(&local_70);
  __return_storage_ptr__->startSample = 0;
  __return_storage_ptr__->endSample = 0;
  __return_storage_ptr__->value = '\0';
LAB_00118044:
  local_74 = 1;
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::~vector
            ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)&asyncByte.value);
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ByteAsyncProcessFlags()
{
    bool flagEncountered = false;
    // Read bytes until non-flag byte
    vector<HdlcByte> readBytes;

    for( ;; )
    {
        HdlcByte asyncByte = ReadByte();
        if( ( asyncByte.value != HDLC_FLAG_VALUE ) && flagEncountered )
        {
            readBytes.push_back( asyncByte );
            break;
        }
        else if( asyncByte.value == HDLC_FLAG_VALUE )
        {
            readBytes.push_back( asyncByte );
            flagEncountered = true;
        }
        if( mAbortFrame )
        {
            GenerateFlagsFrames( readBytes );
            HdlcByte b;
            b.startSample = 0;
            b.endSample = 0;
            b.value = 0;
            return b;
        }
    }

    GenerateFlagsFrames( readBytes );

    HdlcByte nonFlagByte = readBytes.back();
    return nonFlagByte;
}